

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.c
# Opt level: O1

void install_units(char *s1,char *s2)

{
  unit *puVar1;
  table *ptVar2;
  long lVar3;
  
  if (UnitsOn != '\x01') {
    return;
  }
  Unit_push(s2);
  ptVar2 = hash(s1);
  if (ptVar2->name != (char *)0x0) {
    printf("Redefinition of units (%s) to:",s1);
    Unit_str(usp);
    printf("\t%s\n",Unit_str::buf);
    printf(" is ignored.\nThey remain:");
    Unit_push(s1);
    Unit_str(usp);
    printf("\t%s\n");
    diag("Units redefinition",(char *)0x0);
  }
  ptVar2->name = s1;
  puVar1 = usp;
  ptVar2->factor = usp->factor;
  lVar3 = 0;
  do {
    ptVar2->dim[lVar3] = puVar1->dim[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 10);
  unit_pop();
  return;
}

Assistant:

void install_units(s1, s2) /* define s1 as s2 */
	char *s1, *s2;
{
	struct table *tp;
	int i;
	
	IFUNITS
	Unit_push(s2);
	tp = hash(s1);
	if (tp->name) {
		printf("Redefinition of units (%s) to:", s1);
		units(usp);
		printf(" is ignored.\nThey remain:");
		Unit_push(s1); units(usp);		
		diag("Units redefinition", (char *)0);
	}
	tp->name = s1;
	tp->factor = usp->factor;
	for (i=0; i<NDIM; i++) {
		tp->dim[i] = usp->dim[i];
	}
	unit_pop();
}